

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_get_header(mg_connection *conn,char *name)

{
  char *name_local;
  mg_connection *conn_local;
  
  if (conn == (mg_connection *)0x0) {
    conn_local = (mg_connection *)0x0;
  }
  else if (conn->connection_type == 1) {
    conn_local = (mg_connection *)
                 get_header((conn->request_info).http_headers,(conn->request_info).num_headers,name)
    ;
  }
  else if (conn->connection_type == 2) {
    conn_local = (mg_connection *)
                 get_header((conn->response_info).http_headers,(conn->response_info).num_headers,
                            name);
  }
  else {
    conn_local = (mg_connection *)0x0;
  }
  return (char *)conn_local;
}

Assistant:

CIVETWEB_API const char *
mg_get_header(const struct mg_connection *conn, const char *name)
{
	if (!conn) {
		return NULL;
	}

	if (conn->connection_type == CONNECTION_TYPE_REQUEST) {
		return get_header(conn->request_info.http_headers,
		                  conn->request_info.num_headers,
		                  name);
	}
	if (conn->connection_type == CONNECTION_TYPE_RESPONSE) {
		return get_header(conn->response_info.http_headers,
		                  conn->response_info.num_headers,
		                  name);
	}
	return NULL;
}